

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

bool __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::reverse_lexicographic_order
          (Simplex_tree<MiniSTOptions> *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  short sVar1;
  stored_size_type *__return_storage_ptr__;
  stored_size_type *psVar2;
  short sVar3;
  Siblings *__return_storage_ptr___00;
  Siblings *pSVar4;
  Simplex_vertex_range rg2;
  Simplex_vertex_range rg1;
  Simplex_handle local_68;
  Simplex_handle local_60;
  Siblings local_58;
  short local_30;
  stored_size_type *local_28;
  short local_20;
  
  local_60 = (Simplex_handle)sh1->m_ptr;
  __return_storage_ptr__ =
       (stored_size_type *)((long)&local_58.members_.m_flat_tree.m_data.m_seq.m_holder + 0x10);
  simplex_vertex_range((Simplex_vertex_range *)__return_storage_ptr__,this,&local_60);
  local_68 = (Simplex_handle)sh2->m_ptr;
  __return_storage_ptr___00 = &local_58;
  simplex_vertex_range((Simplex_vertex_range *)__return_storage_ptr___00,this,&local_68);
  while( true ) {
    __return_storage_ptr__ = (stored_size_type *)*__return_storage_ptr__;
    __return_storage_ptr___00 =
         (((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<MiniSTOptions>_>,_boost::iterators::incrementable_traversal_tag>
            *)&__return_storage_ptr___00->oncles_)->m_Begin).sib_;
    psVar2 = local_28;
    pSVar4 = __return_storage_ptr___00;
    sVar3 = local_20;
    sVar1 = local_58.parent_;
    if ((local_30 == local_20 && __return_storage_ptr__ == local_28) ||
       (psVar2 = __return_storage_ptr__,
       pSVar4 = (Siblings *)local_58.members_.m_flat_tree.m_data.m_seq.m_holder.m_start,
       sVar3 = local_30, sVar1 = (short)local_58.members_.m_flat_tree.m_data.m_seq.m_holder.m_size,
       local_58.parent_ == (short)local_58.members_.m_flat_tree.m_data.m_seq.m_holder.m_size &&
       __return_storage_ptr___00 ==
       (Siblings *)local_58.members_.m_flat_tree.m_data.m_seq.m_holder.m_start)) break;
    if (local_30 != local_58.parent_) {
      return local_30 < local_58.parent_;
    }
    local_30 = *(short *)(__return_storage_ptr__ + 1);
    local_58.parent_ = __return_storage_ptr___00->parent_;
  }
  return (sVar3 == local_20 && psVar2 == local_28) &&
         (sVar1 != (short)local_58.members_.m_flat_tree.m_data.m_seq.m_holder.m_size ||
         pSVar4 != (Siblings *)local_58.members_.m_flat_tree.m_data.m_seq.m_holder.m_start);
}

Assistant:

bool reverse_lexicographic_order(Simplex_handle sh1, Simplex_handle sh2) const {
    Simplex_vertex_range rg1 = simplex_vertex_range(sh1);
    Simplex_vertex_range rg2 = simplex_vertex_range(sh2);
    Simplex_vertex_iterator it1 = rg1.begin();
    Simplex_vertex_iterator it2 = rg2.begin();
    while (it1 != rg1.end() && it2 != rg2.end()) {
      if (*it1 == *it2) {
        ++it1;
        ++it2;
      } else {
        return *it1 < *it2;
      }
    }
    return ((it1 == rg1.end()) && (it2 != rg2.end()));
  }